

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O1

QList<QPlatformScreen::Mode> * __thiscall
QEglFSKmsScreen::modes(QList<QPlatformScreen::Mode> *__return_storage_ptr__,QEglFSKmsScreen *this)

{
  long lVar1;
  _drmModeModeInfo *p_Var2;
  long lVar3;
  long in_FS_OFFSET;
  Mode local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Mode *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QPlatformScreen::Mode>::reserve(__return_storage_ptr__,(this->m_output).modes.d.size);
  lVar1 = (this->m_output).modes.d.size;
  if (lVar1 != 0) {
    p_Var2 = (this->m_output).modes.d.ptr;
    lVar3 = 0;
    do {
      local_40.size.wd.m_i = (int)*(ushort *)(p_Var2->name + lVar3 + -0x20);
      local_40.size.ht.m_i = (int)*(ushort *)(p_Var2->name + lVar3 + -0x16);
      local_40.refreshRate = 60.0;
      if (*(uint *)(p_Var2->name + lVar3 + -0xc) != 0) {
        local_40.refreshRate = (qreal)*(uint *)(p_Var2->name + lVar3 + -0xc);
      }
      QtPrivate::QMovableArrayOps<QPlatformScreen::Mode>::emplace<QPlatformScreen::Mode>
                ((QMovableArrayOps<QPlatformScreen::Mode> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_40);
      QList<QPlatformScreen::Mode>::end(__return_storage_ptr__);
      lVar3 = lVar3 + 0x44;
    } while (lVar1 * 0x44 != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPlatformScreen::Mode> QEglFSKmsScreen::modes() const
{
    QList<QPlatformScreen::Mode> list;
    list.reserve(m_output.modes.size());

    for (const drmModeModeInfo &info : std::as_const(m_output.modes))
        list.append({QSize(info.hdisplay, info.vdisplay),
                     qreal(info.vrefresh > 0 ? info.vrefresh : 60)});

    return list;
}